

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_01;
  cmGlobalGenerator *this_02;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  char *pcVar5;
  ostream *poVar6;
  cmNinjaTargetGenerator *pcVar7;
  _Alloc_hider _Var8;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_80,pcVar5,&local_81);
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_40,pcVar5,&local_82);
  cmOutputConverter::ConvertToRelativePath
            (&local_60,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_80,&local_40);
  this_00 = &this->HomeRelativeOutputPath;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)this_00);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->HomeRelativeOutputPath)._M_string_length,0x5f2b3e);
  }
  WriteProcessedMakefile
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  bVar2 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar2) {
    WriteBuildFileTop(this);
    WritePools(this,*(ostream **)
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1]
                      .TryCompileTimeout);
    this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    pcVar5 = cmMakefile::GetSafeDefinition(this_01,&local_80);
    std::__cxx11::string::string((string *)&local_60,pcVar5,(allocator *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_60._M_string_length != (char *)0x0) {
      poVar6 = *(ostream **)
                &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 TryCompileTimeout;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"localized /showIncludes string","");
      cmGlobalNinjaGenerator::WriteComment(poVar6,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      poVar6 = *(ostream **)
                &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 TryCompileTimeout;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"msvc_deps_prefix = ",0x13);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_60,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  _Var8._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_dataplus._M_p != (pointer)local_60._M_string_length) {
    do {
      TVar4 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var8._M_p);
      if (TVar4 != INTERFACE_LIBRARY) {
        pcVar7 = cmNinjaTargetGenerator::New(*(cmGeneratorTarget **)_Var8._M_p);
        if (pcVar7 != (cmNinjaTargetGenerator *)0x0) {
          (*(pcVar7->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(pcVar7);
          this_02 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
          bVar2 = cmGlobalGenerator::IsExcluded
                            (this_02,*(this_02->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                             *(cmGeneratorTarget **)_Var8._M_p);
          if (!bVar2) {
            cmGlobalNinjaGenerator::AddDependencyToAll
                      ((cmGlobalNinjaGenerator *)
                       (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                       *(cmGeneratorTarget **)_Var8._M_p);
          }
          (*(pcVar7->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(pcVar7);
        }
      }
      _Var8._M_p = _Var8._M_p + 8;
    } while (_Var8._M_p != (pointer)local_60._M_string_length);
  }
  WriteCustomCommandBuildStatements(this);
  if (local_60._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_60._M_dataplus._M_p,
                    local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->ConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath = "";
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = " << showIncludesPrefix
                                 << "\n\n";
    }
  }

  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if ((*t)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(*t);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(
            this->GetGlobalNinjaGenerator()->GetLocalGenerators()[0], *t)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(*t);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}